

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase135::run(TestCase135 *this)

{
  void *pvVar1;
  undefined8 uVar2;
  Array<kj::(anonymous_namespace)::TestObject> array;
  void *local_198;
  undefined8 uStack_190;
  undefined8 *local_188;
  Runnable local_180;
  void **local_178;
  NullableValue<kj::Exception> local_170;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  local_198 = _::HeapArrayDisposer::allocateImpl
                        (4,0x20,0x20,
                         _::HeapArrayDisposer::
                         Allocate_<kj::(anonymous_namespace)::TestObject,_false,_false>::construct,
                         _::HeapArrayDisposer::
                         Allocate_<kj::(anonymous_namespace)::TestObject,_false,_false>::destruct);
  uStack_190 = 0x20;
  local_188 = &_::HeapArrayDisposer::instance;
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    local_170.isSet = true;
    local_170._1_3_ = 0;
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x8c,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",(int *)&local_170,
               &(anonymous_namespace)::TestObject::count);
  }
  (anonymous_namespace)::TestObject::throwAt = 0x10;
  local_180._vptr_Runnable = (_func_int **)&PTR_run_001bfaf0;
  local_178 = &local_198;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,&local_180);
  if (local_170.isSet == true) {
    Exception::~Exception(&local_170.field_1.value);
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[84]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { array = nullptr; }) != nullptr\""
               ,(char (*) [84])
                "failed: expected ::kj::runCatchingExceptions([&]() { array = nullptr; }) != nullptr"
              );
  }
  if (((anonymous_namespace)::TestObject::count != 0) && (_::Debug::minSeverity < 3)) {
    local_170.isSet = false;
    local_170._1_3_ = 0;
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
               (char (*) [44])"failed: expected (0) == (TestObject::count)",(int *)&local_170,
               &(anonymous_namespace)::TestObject::count);
  }
  uVar2 = uStack_190;
  pvVar1 = local_198;
  if (local_198 != (void *)0x0) {
    local_198 = (void *)0x0;
    uStack_190 = 0;
    (**(code **)*local_188)
              (local_188,pvVar1,4,uVar2,uVar2,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject,_false>::destruct);
  }
  return;
}

Assistant:

TEST(Array, ThrowingDestructor) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array = heapArray<TestObject>(32);
  EXPECT_EQ(32, TestObject::count);

  // If a destructor throws, all elements should still be destroyed.
  TestObject::throwAt = 16;
  EXPECT_ANY_THROW(array = nullptr);
  EXPECT_EQ(0, TestObject::count);
}